

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O3

JDIMENSION jpeg_write_scanlines(j_compress_ptr cinfo,JSAMPARRAY scanlines,JDIMENSION num_lines)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_progress_mgr *pjVar3;
  uint in_EAX;
  JDIMENSION JVar4;
  JDIMENSION row_ctr;
  undefined8 uStack_28;
  
  iVar1 = cinfo->global_state;
  uStack_28._0_4_ = in_EAX;
  if (iVar1 != 0x65) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->image_height <= cinfo->next_scanline) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x7e;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,-1);
  }
  pjVar3 = cinfo->progress;
  if (pjVar3 != (jpeg_progress_mgr *)0x0) {
    pjVar3->pass_counter = (ulong)cinfo->next_scanline;
    pjVar3->pass_limit = (ulong)cinfo->image_height;
    (*pjVar3->progress_monitor)((j_common_ptr)cinfo);
  }
  if (cinfo->master->call_pass_startup != 0) {
    (*cinfo->master->pass_startup)(cinfo);
  }
  JVar4 = cinfo->image_height - cinfo->next_scanline;
  if (num_lines <= JVar4) {
    JVar4 = num_lines;
  }
  uStack_28 = (ulong)(uint)uStack_28;
  (*cinfo->main->process_data)(cinfo,scanlines,(JDIMENSION *)((long)&uStack_28 + 4),JVar4);
  cinfo->next_scanline = cinfo->next_scanline + uStack_28._4_4_;
  return uStack_28._4_4_;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_write_scanlines (j_compress_ptr cinfo, JSAMPARRAY scanlines,
		      JDIMENSION num_lines)
{
  JDIMENSION row_ctr, rows_left;

  if (cinfo->global_state != CSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->next_scanline >= cinfo->image_height)
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long) cinfo->next_scanline;
    cinfo->progress->pass_limit = (long) cinfo->image_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
  }

  /* Give master control module another chance if this is first call to
   * jpeg_write_scanlines.  This lets output of the frame/scan headers be
   * delayed so that application can write COM, etc, markers between
   * jpeg_start_compress and jpeg_write_scanlines.
   */
  if (cinfo->master->call_pass_startup)
    (*cinfo->master->pass_startup) (cinfo);

  /* Ignore any extra scanlines at bottom of image. */
  rows_left = cinfo->image_height - cinfo->next_scanline;
  if (num_lines > rows_left)
    num_lines = rows_left;

  row_ctr = 0;
  (*cinfo->main->process_data) (cinfo, scanlines, &row_ctr, num_lines);
  cinfo->next_scanline += row_ctr;
  return row_ctr;
}